

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall CInput::UpdateActiveJoystick(CInput *this)

{
  int iVar1;
  CJoystick *pCVar2;
  long lVar3;
  long in_FS_OFFSET;
  range r;
  plain_range<CInput::CJoystick> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (long)(this->m_aJoysticks).num_elements;
  if (lVar3 != 0) {
    this->m_pActiveJoystick = (CJoystick *)0x0;
    local_38.begin = (this->m_aJoysticks).list;
    local_38.end = local_38.begin + lVar3;
    while (local_38.begin < local_38.end) {
      pCVar2 = plain_range<CInput::CJoystick>::front(&local_38);
      iVar1 = str_comp(pCVar2->m_aGUID,this->m_pConfig->m_JoystickGUID);
      if (iVar1 == 0) {
        this->m_pActiveJoystick = pCVar2;
        goto LAB_00121164;
      }
      plain_range<CInput::CJoystick>::pop_front(&local_38);
    }
    if (this->m_pActiveJoystick == (CJoystick *)0x0) {
      this->m_pActiveJoystick = (this->m_aJoysticks).list;
    }
  }
LAB_00121164:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CInput::UpdateActiveJoystick()
{
	if(m_aJoysticks.size() == 0)
		return;
	m_pActiveJoystick = 0x0;
	for(array<CJoystick>::range r = m_aJoysticks.all(); !r.empty(); r.pop_front())
	{
		CJoystick &Joystick = r.front();
		if(str_comp(Joystick.GetGUID(), Config()->m_JoystickGUID) == 0)
		{
			m_pActiveJoystick = &Joystick;
			return;
		}
	}
	// Fall back to first joystick if no match was found
	if(!m_pActiveJoystick)
		m_pActiveJoystick = &m_aJoysticks[0];
}